

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O3

void run_container_andnot(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  rle16_t *prVar1;
  rle16_t *prVar2;
  rle16_t *prVar3;
  uint uVar4;
  uint uVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int32_t iVar13;
  uint uVar14;
  
  iVar7 = src_2->n_runs + src_1->n_runs;
  if (dst->capacity < iVar7) {
    run_container_grow(dst,iVar7,false);
  }
  dst->n_runs = 0;
  iVar13 = src_1->n_runs;
  if (0 < iVar13) {
    prVar1 = src_1->runs;
    prVar2 = src_2->runs;
    uVar5 = (uint)prVar2->value;
    uVar10 = (uint)prVar2->value + (uint)prVar2->length + 1;
    uVar8 = (uint)prVar1->value;
    uVar9 = (uint)prVar1->length + (uint)prVar1->value + 1;
    iVar7 = 0;
    uVar14 = 0;
    iVar12 = 0;
    do {
      uVar6 = (ushort)uVar8;
      if (src_2->n_runs <= iVar12) {
        prVar2 = dst->runs;
        dst->n_runs = iVar7 + 1;
        prVar2[iVar7].value = uVar6;
        prVar2[iVar7].length = (short)uVar9 + ~uVar6;
        iVar12 = uVar14 + 1;
        iVar11 = src_1->n_runs - iVar12;
        if (iVar11 == 0 || src_1->n_runs < iVar12) {
          return;
        }
        memcpy(prVar2 + (iVar7 + 1),prVar1 + iVar12,(long)iVar11 << 2);
        dst->n_runs = dst->n_runs + ~uVar14 + src_1->n_runs;
        return;
      }
      uVar4 = uVar8;
      if (uVar5 < uVar9) {
        if (uVar8 < uVar10) {
          if (uVar8 < uVar5) {
            prVar3 = dst->runs;
            dst->n_runs = iVar7 + 1;
            prVar3[iVar7].value = uVar6;
            prVar3[iVar7].length = ~uVar6 + (short)uVar5;
            iVar13 = src_1->n_runs;
            iVar7 = iVar7 + 1;
          }
          uVar4 = uVar10;
          if (uVar9 <= uVar10) goto LAB_0011f666;
        }
        else {
          iVar12 = iVar12 + 1;
          if (iVar12 < src_2->n_runs) {
            uVar5 = (uint)prVar2[iVar12].value;
            uVar10 = prVar2[iVar12].length + uVar5 + 1;
          }
        }
      }
      else {
        prVar3 = dst->runs;
        dst->n_runs = iVar7 + 1;
        prVar3[iVar7].value = uVar6;
        prVar3[iVar7].length = ~uVar6 + (short)uVar9;
        iVar13 = src_1->n_runs;
        iVar7 = iVar7 + 1;
LAB_0011f666:
        uVar14 = uVar14 + 1;
        uVar4 = uVar8;
        if ((int)uVar14 < iVar13) {
          uVar9 = (uint)prVar1[(int)uVar14].length + (uint)prVar1[(int)uVar14].value + 1;
          uVar4 = (uint)prVar1[(int)uVar14].value;
        }
      }
      uVar8 = uVar4;
    } while ((int)uVar14 < iVar13);
  }
  return;
}

Assistant:

void run_container_andnot(const run_container_t *src_1,
                          const run_container_t *src_2, run_container_t *dst) {
    // following Java implementation as of June 2016

    if (dst->capacity < src_1->n_runs + src_2->n_runs)
        run_container_grow(dst, src_1->n_runs + src_2->n_runs, false);

    dst->n_runs = 0;

    int rlepos1 = 0;
    int rlepos2 = 0;
    int32_t start = src_1->runs[rlepos1].value;
    int32_t end = start + src_1->runs[rlepos1].length + 1;
    int32_t start2 = src_2->runs[rlepos2].value;
    int32_t end2 = start2 + src_2->runs[rlepos2].length + 1;

    while ((rlepos1 < src_1->n_runs) && (rlepos2 < src_2->n_runs)) {
        if (end <= start2) {
            // output the first run
            dst->runs[dst->n_runs++] = MAKE_RLE16(start, end - start - 1);
            rlepos1++;
            if (rlepos1 < src_1->n_runs) {
                start = src_1->runs[rlepos1].value;
                end = start + src_1->runs[rlepos1].length + 1;
            }
        } else if (end2 <= start) {
            // exit the second run
            rlepos2++;
            if (rlepos2 < src_2->n_runs) {
                start2 = src_2->runs[rlepos2].value;
                end2 = start2 + src_2->runs[rlepos2].length + 1;
            }
        } else {
            if (start < start2) {
                dst->runs[dst->n_runs++] =
                    MAKE_RLE16(start, start2 - start - 1);
            }
            if (end2 < end) {
                start = end2;
            } else {
                rlepos1++;
                if (rlepos1 < src_1->n_runs) {
                    start = src_1->runs[rlepos1].value;
                    end = start + src_1->runs[rlepos1].length + 1;
                }
            }
        }
    }
    if (rlepos1 < src_1->n_runs) {
        dst->runs[dst->n_runs++] = MAKE_RLE16(start, end - start - 1);
        rlepos1++;
        if (rlepos1 < src_1->n_runs) {
            memcpy(dst->runs + dst->n_runs, src_1->runs + rlepos1,
                   sizeof(rle16_t) * (src_1->n_runs - rlepos1));
            dst->n_runs += src_1->n_runs - rlepos1;
        }
    }
}